

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
* duckdb::
  DefaultMapType<std::unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
  ::CreateEmpty(ArenaAllocator *param_1)

{
  unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
  *__s;
  
  __s = (unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
         *)operator_new(0x38);
  memset(__s,0,0x38);
  std::
  unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
  ::unordered_map((unordered_map<short,_unsigned_long,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
                   *)0xbadcf1);
  return __s;
}

Assistant:

static TYPE *CreateEmpty(ArenaAllocator &) {
		return new TYPE();
	}